

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O2

Hcell * Hcell::functor(Hcell *__return_storage_ptr__,Functor *f)

{
  Hcell(__return_storage_ptr__);
  __return_storage_ptr__->tag = Functor;
  Functor::operator=(&__return_storage_ptr__->f_,f);
  return __return_storage_ptr__;
}

Assistant:

static Hcell functor(Functor f) {
        Hcell h;
        h.tag = Htag::Functor;
        h.f_ = f;
        return h;
    }